

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void process_ircs(void)

{
  long lVar1;
  uint i;
  ulong uVar2;
  BoolView local_48;
  BoolView local_38;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < ircs.sz; uVar2 = uVar2 + 1) {
    local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_38.s = (&((ircs.data)->r).s)[lVar1];
    local_38.v = *(int *)((long)&((ircs.data)->r).v + lVar1);
    int_rel_reif_real(*(IntVar **)((long)&(ircs.data)->x + lVar1),
                      *(IntRelType *)((long)&(ircs.data)->t + lVar1),
                      *(int *)((long)&(ircs.data)->c + lVar1),&local_38);
    lVar1 = lVar1 + 0x20;
  }
  vec<IRR>::clear(&ircs,true);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < ihrcs.sz; uVar2 = uVar2 + 1) {
    local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_48.s = (&((ihrcs.data)->r).s)[lVar1];
    local_48.v = *(int *)((long)&((ihrcs.data)->r).v + lVar1);
    int_rel_half_reif_real
              (*(IntVar **)((long)&(ihrcs.data)->x + lVar1),
               *(IntRelType *)((long)&(ihrcs.data)->t + lVar1),
               *(int *)((long)&(ihrcs.data)->c + lVar1),&local_48);
    lVar1 = lVar1 + 0x20;
  }
  vec<IRR>::clear(&ihrcs,true);
  return;
}

Assistant:

void process_ircs() {
	for (unsigned int i = 0; i < ircs.size(); i++) {
		int_rel_reif_real(ircs[i].x, ircs[i].t, ircs[i].c, ircs[i].r);
	}
	ircs.clear(true);
	for (unsigned int j = 0; j < ihrcs.size(); ++j) {
		int_rel_half_reif_real(ihrcs[j].x, ihrcs[j].t, ihrcs[j].c, ihrcs[j].r);
	}
	ihrcs.clear(true);
}